

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLin>::operator()
          (RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  uint uVar6;
  GetterHeatmap<short> *pGVar7;
  ImDrawVert *pIVar8;
  ImDrawIdx *pIVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  ImVec2 IVar13;
  double dVar14;
  double dVar15;
  ImDrawIdx IVar16;
  ImU32 IVar17;
  bool bVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  ImVec2 IVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ImVec2 IVar27;
  float fVar28;
  double dStack_60;
  
  pGVar7 = this->Getter;
  iVar5 = pGVar7->Cols;
  fVar19 = (float)(((double)(int)pGVar7->Values[prim] - pGVar7->ScaleMin) /
                  (pGVar7->ScaleMax - pGVar7->ScaleMin));
  fVar28 = 1.0;
  if (fVar19 <= 1.0) {
    fVar28 = fVar19;
  }
  dVar14 = (pGVar7->HalfSize).x;
  dVar15 = (pGVar7->HalfSize).y;
  dVar2 = pGVar7->Height;
  dVar10 = pGVar7->Width;
  dVar3 = pGVar7->YDir;
  dVar20 = pGVar7->XRef + dVar14;
  auVar12._8_4_ = SUB84(pGVar7->YRef,0);
  auVar12._0_8_ = dVar20;
  auVar12._12_4_ = (int)((ulong)pGVar7->YRef >> 0x20);
  IVar17 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar28));
  if (IVar17 < 0x1000000) {
    bVar18 = false;
  }
  else {
    dVar20 = (double)(prim % iVar5) * dVar10 + dVar20;
    dStack_60 = auVar12._8_8_;
    dStack_60 = ((double)(prim / iVar5) * dVar2 + dVar15) * dVar3 + dStack_60;
    iVar5 = this->Transformer->YAxis;
    IVar4 = GImPlot->PixelRange[iVar5].Min;
    dVar21 = (double)IVar4.x;
    dVar23 = (double)IVar4.y;
    dVar2 = (GImPlot->CurrentPlot->XAxis).Range.Min;
    dVar3 = GImPlot->CurrentPlot->YAxis[iVar5].Range.Min;
    dVar10 = ((dVar20 - dVar14) - dVar2) * GImPlot->Mx + dVar21;
    dVar11 = ((dStack_60 + dVar15) - dVar3) * GImPlot->My[iVar5] + dVar23;
    fVar25 = (float)dVar10;
    fVar26 = (float)dVar11;
    dVar21 = ((dVar20 + dVar14) - dVar2) * GImPlot->Mx + dVar21;
    dVar23 = ((dStack_60 - dVar15) - dVar3) * GImPlot->My[iVar5] + dVar23;
    fVar19 = (float)dVar21;
    fVar24 = (float)dVar23;
    fVar28 = fVar24;
    if (fVar26 <= fVar24) {
      fVar28 = fVar26;
    }
    bVar18 = false;
    if ((fVar28 < (cull_rect->Max).y) &&
       (fVar28 = (float)(~-(uint)(fVar26 <= fVar24) & (uint)fVar26 |
                        (uint)fVar24 & -(uint)(fVar26 <= fVar24)), pfVar1 = &(cull_rect->Min).y,
       *pfVar1 <= fVar28 && fVar28 != *pfVar1)) {
      fVar28 = fVar25;
      if (fVar19 <= fVar25) {
        fVar28 = fVar19;
      }
      if ((fVar28 < (cull_rect->Max).x) &&
         (fVar28 = (float)(~-(uint)(fVar19 <= fVar25) & (uint)fVar19 |
                          -(uint)(fVar19 <= fVar25) & (uint)fVar25),
         (cull_rect->Min).x <= fVar28 && fVar28 != (cull_rect->Min).x)) {
        IVar27.x = (float)dVar10;
        IVar27.y = (float)dVar23;
        IVar22.x = (float)dVar21;
        IVar22.y = (float)dVar11;
        DrawList->_VtxWritePtr->pos = IVar27;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar8 = DrawList->_VtxWritePtr;
        pIVar8->col = IVar17;
        IVar13.y = fVar26;
        IVar13.x = fVar25;
        pIVar8[1].pos = IVar13;
        pIVar8[1].uv = *uv;
        pIVar8 = DrawList->_VtxWritePtr;
        pIVar8[1].col = IVar17;
        pIVar8[2].pos = IVar22;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar8 = DrawList->_VtxWritePtr;
        pIVar8[2].col = IVar17;
        IVar4.y = fVar24;
        IVar4.x = fVar19;
        pIVar8[3].pos = IVar4;
        pIVar8[3].uv = *uv;
        pIVar8 = DrawList->_VtxWritePtr;
        pIVar8[3].col = IVar17;
        DrawList->_VtxWritePtr = pIVar8 + 4;
        uVar6 = DrawList->_VtxCurrentIdx;
        pIVar9 = DrawList->_IdxWritePtr;
        IVar16 = (ImDrawIdx)uVar6;
        *pIVar9 = IVar16;
        pIVar9[1] = IVar16 + 1;
        pIVar9[2] = IVar16 + 3;
        pIVar9[3] = IVar16 + 1;
        pIVar9[4] = IVar16 + 2;
        pIVar9[5] = IVar16 + 3;
        DrawList->_IdxWritePtr = pIVar9 + 6;
        DrawList->_VtxCurrentIdx = uVar6 + 4;
        bVar18 = true;
      }
    }
  }
  return bVar18;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }